

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OdiPublisher.cpp
# Opt level: O0

bool OdiPublisher::PublishMetricFile
               (char *metric_file_name,char *odi_dir,char *data_dir,time_t current_time)

{
  int iVar1;
  bool local_451;
  size_t sStack_450;
  bool ret;
  size_t name_offset;
  int day;
  int month;
  int year;
  int metric_id;
  char json_file_name [512];
  char odi_file_name [512];
  time_t current_time_local;
  char *data_dir_local;
  char *odi_dir_local;
  char *metric_file_name_local;
  
  month = 0;
  day = 0;
  name_offset._4_4_ = 0;
  name_offset._0_4_ = 0;
  sStack_450 = 0;
  local_451 = ithimetrics::ParseMetricFileName
                        (metric_file_name,&month,&day,(int *)((long)&name_offset + 4),
                         (int *)&name_offset,&stack0xfffffffffffffbb0);
  if (local_451) {
    iVar1 = snprintf(json_file_name + 0x1f8,0x200,"%s%sITHI-M%1d%s%04d%02d%02d-2359.csv",odi_dir,"/"
                     ,(ulong)(uint)month,"/",day,name_offset._4_4_,(undefined4)name_offset);
    local_451 = 0 < iVar1;
  }
  if (local_451 != false) {
    local_451 = CopyFile(metric_file_name,json_file_name + 0x1f8);
  }
  if (local_451 != false) {
    iVar1 = snprintf((char *)&year,0x200,"%s-metadata.json",json_file_name + 0x1f8);
    local_451 = 0 < iVar1;
    if (local_451) {
      local_451 = CopyUpdateJsonFile(month,(char *)&year,data_dir,current_time);
    }
  }
  return local_451;
}

Assistant:

bool OdiPublisher::PublishMetricFile(const char * metric_file_name, char const * odi_dir, char const * data_dir, time_t current_time)
{
    char odi_file_name[512];
    char json_file_name[512];
    int metric_id = 0;
    int year = 0;
    int month = 0;
    int day = 0;
    size_t name_offset = 0;
    bool ret;

    /* Parse the file name, obtain metric and date */
    ret = ithimetrics::ParseMetricFileName(metric_file_name, &metric_id, &year, &month, &day, &name_offset);

    /* Get the oid metric name */
    if (ret) {
        ret = snprintf(odi_file_name, sizeof(odi_file_name), "%s%sITHI-M%1d%s%04d%02d%02d-2359.csv",
            odi_dir, ITHI_FILE_PATH_SEP, metric_id, ITHI_FILE_PATH_SEP, year, month, day) > 0;
    }

    /* Copy the metric file */
    if (ret) {
        ret = CopyFile(metric_file_name, odi_file_name);
    }

    /* Get the JSON file name and copy it */
    if (ret) {
        ret = (snprintf(json_file_name, sizeof(json_file_name), "%s-metadata.json", odi_file_name) > 0);

        if (ret) {
            ret = CopyUpdateJsonFile(metric_id, json_file_name, data_dir, current_time);
        }
    }


    return ret;
}